

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int64_t fio_atol(char **pstr)

{
  bool bVar1;
  uint8_t uVar2;
  ushort **ppuVar3;
  bool bVar4;
  ulong uStack_28;
  uint8_t invert;
  uint64_t result;
  char *str;
  char **pstr_local;
  
  result = (uint64_t)*pstr;
  uStack_28 = 0;
  bVar1 = false;
  str = (char *)pstr;
  while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*(char *)result] & 0x2000) != 0) {
    result = result + 1;
  }
  if (*(char *)result == '-') {
    bVar1 = true;
    result = result + 1;
  }
  else if (*(char *)result == '+') {
    result = result + 1;
  }
  if (((*(char *)result == 'B') || (*(char *)result == 'b')) ||
     ((*(char *)result == '0' && ((*(char *)(result + 1) == 'b' || (*(char *)(result + 1) == 'B'))))
     )) {
    if (*(char *)result == '0') {
      result = result + 1;
    }
    result = result + 1;
    fio_atol_skip_zero((char **)&result);
    while( true ) {
      bVar4 = true;
      if (*(char *)result != '0') {
        bVar4 = *(char *)result == '1';
      }
      if (!bVar4) break;
      uStack_28 = uStack_28 << 1 | (long)(*(char *)result + -0x30);
      result = result + 1;
    }
  }
  else if (((*(char *)result == 'x') || (*(char *)result == 'X')) ||
          ((*(char *)result == '0' &&
           ((*(char *)(result + 1) == 'x' || (*(char *)(result + 1) == 'X')))))) {
    if (*(char *)result == '0') {
      result = result + 1;
    }
    result = result + 1;
    fio_atol_skip_zero((char **)&result);
    uStack_28 = fio_atol_consume_hex((char **)&result);
    uVar2 = fio_atol_skip_hex_test((char **)&result);
    if (uVar2 != '\0') {
      return 0;
    }
  }
  else {
    if (*(char *)result == '0') {
      fio_atol_skip_zero((char **)&result);
      uStack_28 = fio_atol_consume((char **)&result,'\b');
      uVar2 = fio_atol_skip_test((char **)&result,'\b');
      if (uVar2 != '\0') {
        return 0;
      }
    }
    else {
      uStack_28 = fio_atol_consume((char **)&result,'\n');
      uVar2 = fio_atol_skip_test((char **)&result,'\n');
      if (uVar2 != '\0') {
        return 0;
      }
    }
    if ((uStack_28 & 0x8000000000000000) != 0) {
      uStack_28 = 0x7fffffffffffffff;
    }
  }
  if (bVar1) {
    uStack_28 = -uStack_28;
  }
  *(uint64_t *)str = result;
  return uStack_28;
}

Assistant:

int64_t fio_atol(char **pstr) {
  /* No binary representation in strtol */
  char *str = *pstr;
  uint64_t result = 0;
  uint8_t invert = 0;
  while (isspace(*str))
    ++(str);
  if (str[0] == '-') {
    invert ^= 1;
    ++str;
  } else if (*str == '+') {
    ++(str);
  }

  if (str[0] == 'B' || str[0] == 'b' ||
      (str[0] == '0' && (str[1] == 'b' || str[1] == 'B'))) {
    /* base 2 */
    if (str[0] == '0')
      str++;
    str++;
    fio_atol_skip_zero(&str);
    while (str[0] == '0' || str[0] == '1') {
      result = (result << 1) | (str[0] - '0');
      str++;
    }
    goto sign; /* no overlow protection, since sign might be embedded */

  } else if (str[0] == 'x' || str[0] == 'X' ||
             (str[0] == '0' && (str[1] == 'x' || str[1] == 'X'))) {
    /* base 16 */
    if (str[0] == '0')
      str++;
    str++;
    fio_atol_skip_zero(&str);
    result = fio_atol_consume_hex(&str);
    if (fio_atol_skip_hex_test(&str)) /* too large for a number */
      return 0;
    goto sign; /* no overlow protection, since sign might be embedded */
  } else if (str[0] == '0') {
    fio_atol_skip_zero(&str);
    /* base 8 */
    result = fio_atol_consume(&str, 8);
    if (fio_atol_skip_test(&str, 8)) /* too large for a number */
      return 0;
  } else {
    /* base 10 */
    result = fio_atol_consume(&str, 10);
    if (fio_atol_skip_test(&str, 10)) /* too large for a number */
      return 0;
  }
  if (result & ((uint64_t)1 << 63))
    result = INT64_MAX; /* signed overflow protection */
sign:
  if (invert)
    result = 0 - result;
  *pstr = str;
  return (int64_t)result;
}